

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_difference_iterator.hpp
# Opt level: O0

symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
* __thiscall
burst::
make_symmetric_difference_iterator<std::initializer_list<int>const,std::initializer_list<int>const,std::greater<void>>
          (symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
           *__return_storage_ptr__,burst *this,undefined8 param_3,
          tuple<const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&> *param_4)

{
  vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
  local_90;
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>
  local_78;
  tuple<const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&> local_48;
  detail local_30 [8];
  tuple<const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&> common_ranges;
  tuple<const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&> *ranges_local;
  
  local_48.
  super__Tuple_impl<0UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>.
  super__Tuple_impl<1UL,_const_std::initializer_list<int>_&>.
  super__Head_base<1UL,_const_std::initializer_list<int>_&,_false>._M_head_impl =
       *(_Head_base<1UL,_const_std::initializer_list<int>_&,_false> *)this;
  local_48.
  super__Tuple_impl<0UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>.
  super__Head_base<0UL,_const_std::initializer_list<int>_&,_false>._M_head_impl =
       *(initializer_list<int> **)(this + 8);
  common_ranges.
  super__Tuple_impl<0UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>.
  super__Head_base<0UL,_const_std::initializer_list<int>_&,_false>._M_head_impl =
       (initializer_list<int> *)this;
  detail::
  uniform_range_tuple_please<std::initializer_list<int>const,std::initializer_list<int>const>
            (local_30,&local_48);
  apply<burst::make_range_vector_t_const&,std::tuple<std::initializer_list<int>const&,std::initializer_list<int>const&>&>
            (&local_90,(burst *)&make_range_vector,(make_range_vector_t *)local_30,param_4);
  own_as_range_t::operator()(&local_78,(own_as_range_t *)&own_as_range,&local_90);
  make_symmetric_difference_iterator<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>>,std::greater<void>>
            (__return_storage_ptr__,(burst *)&local_78);
  boost::
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>
  ::~iterator_range(&local_78);
  std::
  vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>::
  ~vector(&local_90);
  return __return_storage_ptr__;
}

Assistant:

auto make_symmetric_difference_iterator (std::tuple<Ranges &...> ranges, Compare compare)
    {
        auto common_ranges = detail::uniform_range_tuple_please(ranges);
        return
            make_symmetric_difference_iterator
            (
                burst::own_as_range(burst::apply(burst::make_range_vector, common_ranges)),
                std::move(compare)
            );
    }